

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O3

void __thiscall
sglr::rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::getAll
          (ObjectManager<sglr::rc::ShaderProgramObjectContainer> *this,
          vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
          *objects)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer ppSVar3;
  
  std::
  vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
  ::resize(objects,(this->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var1 = (this->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    ppSVar3 = (objects->
              super__Vector_base<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    do {
      *ppSVar3 = (ShaderProgramObjectContainer *)p_Var1[1]._M_parent;
      ppSVar3 = ppSVar3 + 1;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void ObjectManager<T>::getAll (typename std::vector<T*>& objects) const
{
	objects.resize(m_objects.size());
	typename std::vector<T*>::iterator dst = objects.begin();

	for (typename std::map<deUint32, T*>::const_iterator i = m_objects.begin();
		 i != m_objects.end(); i++)
	{
		*dst++ = i->second;
	}
}